

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectAddMult(Wlc_Ntk_t *p,Wlc_BstPar_t *pPar,int *pCountA,int *pCountM)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int iVar4;
  int Id;
  int *piVar5;
  
  *pCountM = 0;
  *pCountA = 0;
  if ((pPar->nAdderLimit != 0) || (pPar->nMultLimit != 0)) {
    p_00 = Vec_IntAlloc(100);
    for (Id = 1; Id < p->iObj; Id = Id + 1) {
      pWVar2 = Wlc_NtkObj(p,Id);
      if ((*(ushort *)pWVar2 & 0x3f) == 0x2d) {
        iVar3 = pPar->nMultLimit;
        if (iVar3 != 0) {
          iVar4 = pWVar2->End - pWVar2->Beg;
          piVar5 = pCountM;
          iVar1 = -iVar4;
          if (0 < iVar4) {
            iVar1 = iVar4;
          }
          goto LAB_00315723;
        }
      }
      else if (((*(ushort *)pWVar2 & 0x3f) == 0x2b) && (iVar3 = pPar->nAdderLimit, iVar3 != 0)) {
        iVar4 = pWVar2->End - pWVar2->Beg;
        piVar5 = pCountA;
        iVar1 = -iVar4;
        if (0 < iVar4) {
          iVar1 = iVar4;
        }
LAB_00315723:
        if (iVar3 <= iVar1 + 1) {
          Vec_IntPush(p_00,Id);
          *piVar5 = *piVar5 + 1;
        }
      }
    }
    if (0 < p_00->nSize) {
      Wlc_NtkCollectBoxes(p,p_00);
      return p_00;
    }
    Vec_IntFree(p_00);
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectAddMult( Wlc_Ntk_t * p, Wlc_BstPar_t * pPar, int * pCountA, int * pCountM )
{
    Vec_Int_t * vBoxIds;
    Wlc_Obj_t * pObj;  int i;
    *pCountA = *pCountM = 0;
    if ( pPar->nAdderLimit == 0 && pPar->nMultLimit == 0 )
        return NULL;
    vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD && pPar->nAdderLimit && Wlc_ObjRange(pObj) >= pPar->nAdderLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountA)++;
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI && pPar->nMultLimit && Wlc_ObjRange(pObj) >= pPar->nMultLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountM)++;
    }
    if ( Vec_IntSize( vBoxIds ) > 0 )
    {
        Wlc_NtkCollectBoxes( p, vBoxIds );
        return vBoxIds;
    }
    Vec_IntFree( vBoxIds );
    return NULL;
}